

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_checker.c
# Opt level: O0

uint8_t cio_check_utf8(cio_utf8_state *state,uint8_t *string,size_t count)

{
  uint8_t uVar1;
  ulong uVar2;
  byte local_59;
  uint8_t character;
  undefined8 uStack_58;
  uint_fast8_t i;
  uint8_t buffer [8];
  size_t i_p;
  ulong uStack_40;
  uint post_length;
  size_t main_length;
  uint8_t *puStack_30;
  uint pre_length;
  uint_fast32_t *s_aligned;
  size_t count_local;
  uint8_t *string_local;
  cio_utf8_state *state_local;
  
  uStack_40 = 0;
  i_p._4_4_ = 0;
  main_length._4_4_ = (uint)count;
  if (7 < count) {
    main_length._4_4_ = 8 - ((uint)string & 7) & 7;
    uStack_40 = count - main_length._4_4_ >> 3;
    i_p._4_4_ = ((uint)count - main_length._4_4_) - (int)(uStack_40 << 3);
  }
  puStack_30 = string + main_length._4_4_;
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  for (; main_length._4_4_ != 0; main_length._4_4_ = main_length._4_4_ - 1) {
    uVar1 = decode(&state->state,&state->codepoint,string[(long)buffer]);
    if (uVar1 == '\f') {
      return '\f';
    }
    buffer = (uint8_t  [8])((long)buffer + 1);
  }
  while (uVar2 = uStack_40 - 1, uStack_40 != 0) {
    uStack_58 = *(undefined8 *)puStack_30;
    puStack_30 = puStack_30 + 8;
    for (local_59 = 0; uStack_40 = uVar2, local_59 < 8; local_59 = local_59 + 1) {
      uVar1 = decode(&state->state,&state->codepoint,
                     *(uint8_t *)((long)&stack0xffffffffffffffa8 + (ulong)local_59));
      if (uVar1 == '\f') {
        return '\f';
      }
    }
  }
  buffer = (uint8_t  [8])(count - i_p._4_4_);
  while( true ) {
    if (i_p._4_4_ == 0) {
      return state->state;
    }
    uVar1 = decode(&state->state,&state->codepoint,string[(long)buffer]);
    if (uVar1 == '\f') break;
    i_p._4_4_ = i_p._4_4_ - 1;
    buffer = (uint8_t  [8])((long)buffer + 1);
  }
  return '\f';
}

Assistant:

uint8_t cio_check_utf8(struct cio_utf8_state *state, const uint8_t *string, size_t count)
{
	const uint_fast32_t *s_aligned = NULL;
	unsigned int pre_length = (unsigned int)count;
	size_t main_length = 0;
	unsigned int post_length = 0;

	if (count >= sizeof(*s_aligned)) {
		pre_length = ((uintptr_t)string) % sizeof(*s_aligned);
		pre_length = (sizeof(*s_aligned) - pre_length) % sizeof(*s_aligned);
		main_length = (count - pre_length) / sizeof(*s_aligned);
		post_length = (unsigned int)(count - pre_length - (main_length * sizeof(*s_aligned)));
	}

	s_aligned = (const void *)(string + pre_length);

	size_t i_p = 0;
	while (pre_length > 0) {
		if (decode(&state->state, &state->codepoint, string[i_p]) == CIO_UTF8_REJECT) {
			return CIO_UTF8_REJECT;
		}

		pre_length--;
		i_p++;
	}

	while (main_length-- > 0) {
		uint8_t buffer[sizeof(uint_fast32_t)];
		memcpy(buffer, s_aligned, sizeof(buffer));
		s_aligned++;
		for (uint_fast8_t i = 0; i < (uint_fast8_t)sizeof(buffer); i++) {
			uint8_t character = buffer[i];
			if (decode(&state->state, &state->codepoint, character) == CIO_UTF8_REJECT) {
				return CIO_UTF8_REJECT;
			}
		}
	}

	i_p = count - post_length;
	while (post_length > 0) {
		if (decode(&state->state, &state->codepoint, string[i_p]) == CIO_UTF8_REJECT) {
			return CIO_UTF8_REJECT;
		}

		post_length--;
		i_p++;
	}

	return state->state;
}